

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O3

string * __thiscall
C3DFile::getParamString_abi_cxx11_(string *__return_storage_ptr__,C3DFile *this,char *id_str)

{
  ulong uVar1;
  ParameterInfo param_info;
  ParameterInfo local_b8;
  ParameterInfo local_68;
  
  local_b8.name_length = -1;
  local_b8.group_id = -1;
  local_b8.name = (char *)0x0;
  local_b8.next_offset = -1;
  local_b8.data_type = -1;
  local_b8.n_dimensions = 0xff;
  local_b8.dimensions = (byte *)0x0;
  local_b8.char_data = (char *)0x0;
  local_b8.int_data = (Sint16 *)0x0;
  local_b8.float_data = (float *)0x0;
  local_b8.descr_length = -1;
  local_b8.description = (char *)0x0;
  local_b8.locked = false;
  getParamInfo(&local_68,this,id_str);
  ParameterInfo::operator=(&local_b8,&local_68);
  ParameterInfo::~ParameterInfo(&local_68);
  if (local_b8.n_dimensions != '\x01') {
    __assert_fail("param_info.n_dimensions == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x6d,"std::string C3DFile::getParamString(const char *)");
  }
  if ((local_b8.data_type != '\x01') && (local_b8.data_type != -1)) {
    __assert_fail("check_param_type<char>(param_info.data_type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x6e,"std::string C3DFile::getParamString(const char *)");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*local_b8.dimensions != 0) {
    uVar1 = 0;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar1 = uVar1 + 1;
    } while (uVar1 < *local_b8.dimensions);
  }
  ParameterInfo::~ParameterInfo(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string C3DFile::getParamString(const char* id_str) {
	ParameterInfo param_info;

	param_info = getParamInfo(id_str);

	assert (param_info.n_dimensions == 1);
	assert (check_param_type<char>(param_info.data_type));

	std::string result;

	int i;
	for (i = 0; i < param_info.dimensions[0]; i++)
		result += param_info.char_data[i];

	return result;
}